

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mpi_miller_rabin(mbedtls_mpi *X,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t count;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  long lStack_e0;
  mbedtls_mpi A;
  mbedtls_mpi W;
  mbedtls_mpi R;
  mbedtls_mpi RR;
  mbedtls_mpi T;
  
  A.s = 1;
  W.n = 0;
  W.p = (mbedtls_mpi_uint *)0x0;
  R.n = 0;
  R.p = (mbedtls_mpi_uint *)0x0;
  T.n = 0;
  T.p = (mbedtls_mpi_uint *)0x0;
  A.n = 0;
  A.p = (mbedtls_mpi_uint *)0x0;
  RR.n = 0;
  RR.p = (mbedtls_mpi_uint *)0x0;
  W.s = A.s;
  R.s = A.s;
  RR.s = A.s;
  T.s = A.s;
  iVar1 = mbedtls_mpi_sub_int(&W,X,1);
  if (iVar1 == 0) {
    count = mbedtls_mpi_lsb(&W);
    iVar1 = mbedtls_mpi_copy(&R,&W);
    if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_shift_r(&R,count), iVar1 == 0)) {
      sVar2 = mbedtls_mpi_bitlen(X);
      if (sVar2 < 0x514) {
        if (sVar2 < 0x352) {
          if (sVar2 < 0x28a) {
            if (sVar2 < 0x15e) {
              if (sVar2 < 0xfa) {
                lStack_e0 = (ulong)(sVar2 < 0x96) * 9 + 0x12;
              }
              else {
                lStack_e0 = 0xc;
              }
            }
            else {
              lStack_e0 = 8;
            }
          }
          else {
            lStack_e0 = 4;
          }
        }
        else {
          lStack_e0 = 3;
        }
      }
      else {
        lStack_e0 = 2;
      }
      lVar4 = 0;
      while ((iVar1 = 0, lVar4 != lStack_e0 &&
             (iVar1 = mbedtls_mpi_fill_random(&A,X->n << 3,f_rng,p_rng), iVar1 == 0))) {
        iVar1 = mbedtls_mpi_cmp_mpi(&A,&W);
        if (-1 < iVar1) {
          sVar2 = mbedtls_mpi_bitlen(&A);
          sVar3 = mbedtls_mpi_bitlen(&W);
          iVar1 = mbedtls_mpi_shift_r(&A,(sVar2 - sVar3) + 1);
          if (iVar1 != 0) break;
        }
        *A.p = *A.p | 3;
        iVar6 = 0x1f;
        do {
          iVar1 = mbedtls_mpi_fill_random(&A,X->n << 3,f_rng,p_rng);
          if (iVar1 != 0) goto LAB_0010dc25;
          sVar2 = mbedtls_mpi_bitlen(&A);
          sVar3 = mbedtls_mpi_bitlen(&W);
          if ((sVar3 <= sVar2 && sVar2 - sVar3 != 0) &&
             (iVar1 = mbedtls_mpi_shift_r(&A,sVar2 - sVar3), iVar1 != 0)) goto LAB_0010dc25;
          bVar7 = iVar6 == 0;
          iVar6 = iVar6 + -1;
          if (bVar7) {
            return -0xe;
          }
          iVar1 = mbedtls_mpi_cmp_mpi(&A,&W);
        } while ((-1 < iVar1) || (iVar1 = mbedtls_mpi_cmp_int(&A,1), iVar1 < 1));
        iVar1 = mbedtls_mpi_exp_mod(&A,&A,&R,X,&RR);
        if (iVar1 != 0) break;
        iVar1 = mbedtls_mpi_cmp_mpi(&A,&W);
        if ((iVar1 != 0) && (iVar1 = mbedtls_mpi_cmp_int(&A,1), iVar1 != 0)) {
          uVar5 = 0;
          do {
            uVar5 = uVar5 + 1;
            if ((count <= uVar5) || (iVar1 = mbedtls_mpi_cmp_mpi(&A,&W), iVar1 == 0)) break;
            iVar1 = mbedtls_mpi_mul_mpi(&T,&A,&A);
            if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_mod_mpi(&A,&T,X), iVar1 != 0))
            goto LAB_0010dc25;
            iVar1 = mbedtls_mpi_cmp_int(&A,1);
          } while (iVar1 != 0);
          iVar6 = mbedtls_mpi_cmp_mpi(&A,&W);
          iVar1 = -0xe;
          if ((iVar6 != 0) || (iVar6 = mbedtls_mpi_cmp_int(&A,1), iVar6 == 0)) break;
        }
        lVar4 = lVar4 + 1;
      }
    }
  }
LAB_0010dc25:
  mbedtls_mpi_free(&W);
  mbedtls_mpi_free(&R);
  mbedtls_mpi_free(&T);
  mbedtls_mpi_free(&A);
  mbedtls_mpi_free(&RR);
  return iVar1;
}

Assistant:

static int mpi_miller_rabin( const mbedtls_mpi *X,
                             int (*f_rng)(void *, unsigned char *, size_t),
                             void *p_rng )
{
    int ret, count;
    size_t i, j, k, n, s;
    mbedtls_mpi W, R, T, A, RR;

    mbedtls_mpi_init( &W ); mbedtls_mpi_init( &R ); mbedtls_mpi_init( &T ); mbedtls_mpi_init( &A );
    mbedtls_mpi_init( &RR );

    /*
     * W = |X| - 1
     * R = W >> lsb( W )
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &W, X, 1 ) );
    s = mbedtls_mpi_lsb( &W );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R, &W ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &R, s ) );

    i = mbedtls_mpi_bitlen( X );
    /*
     * HAC, table 4.4
     */
    n = ( ( i >= 1300 ) ?  2 : ( i >=  850 ) ?  3 :
          ( i >=  650 ) ?  4 : ( i >=  350 ) ?  8 :
          ( i >=  250 ) ? 12 : ( i >=  150 ) ? 18 : 27 );

    for( i = 0; i < n; i++ )
    {
        /*
         * pick a random A, 1 < A < |X| - 1
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &A, X->n * ciL, f_rng, p_rng ) );

        if( mbedtls_mpi_cmp_mpi( &A, &W ) >= 0 )
        {
            j = mbedtls_mpi_bitlen( &A ) - mbedtls_mpi_bitlen( &W );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &A, j + 1 ) );
        }
        A.p[0] |= 3;

        count = 0;
        do {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &A, X->n * ciL, f_rng, p_rng ) );

            j = mbedtls_mpi_bitlen( &A );
            k = mbedtls_mpi_bitlen( &W );
            if (j > k) {
                MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &A, j - k ) );
            }

            if (count++ > 30) {
                return MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            }

        } while ( mbedtls_mpi_cmp_mpi( &A, &W ) >= 0 ||
                  mbedtls_mpi_cmp_int( &A, 1 )  <= 0    );

        /*
         * A = A^R mod |X|
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &A, &A, &R, X, &RR ) );

        if( mbedtls_mpi_cmp_mpi( &A, &W ) == 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
            continue;

        j = 1;
        while( j < s && mbedtls_mpi_cmp_mpi( &A, &W ) != 0 )
        {
            /*
             * A = A * A mod |X|
             */
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &A, &A ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &A, &T, X  ) );

            if( mbedtls_mpi_cmp_int( &A, 1 ) == 0 )
                break;

            j++;
        }

        /*
         * not prime if A != |X| - 1 or A == 1
         */
        if( mbedtls_mpi_cmp_mpi( &A, &W ) != 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
        {
            ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            break;
        }
    }

cleanup:
    mbedtls_mpi_free( &W ); mbedtls_mpi_free( &R ); mbedtls_mpi_free( &T ); mbedtls_mpi_free( &A );
    mbedtls_mpi_free( &RR );

    return( ret );
}